

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  StringVector *pSVar1;
  ItemSimilarityRecommender *pIVar2;
  Int64Vector *pIVar3;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/ItemSimilarityRecommender.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
                    *)_ItemSimilarityRecommender_ConnectedItem_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
                    *)_ItemSimilarityRecommender_SimilarItems_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender> *)
             _ItemSimilarityRecommender_default_instance_);
  pSVar1 = StringVector::internal_default_instance();
  pIVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender> *)
                      _ItemSimilarityRecommender_default_instance_);
  pIVar2->itemstringids_ = pSVar1;
  pIVar3 = Int64Vector::internal_default_instance();
  pIVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::ItemSimilarityRecommender> *)
                      _ItemSimilarityRecommender_default_instance_);
  pIVar2->itemint64ids_ = pIVar3;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _ItemSimilarityRecommender_ConnectedItem_default_instance_.DefaultConstruct();
  _ItemSimilarityRecommender_SimilarItems_default_instance_.DefaultConstruct();
  _ItemSimilarityRecommender_default_instance_.DefaultConstruct();
  _ItemSimilarityRecommender_default_instance_.get_mutable()->itemstringids_ = const_cast< ::CoreML::Specification::StringVector*>(
      ::CoreML::Specification::StringVector::internal_default_instance());
  _ItemSimilarityRecommender_default_instance_.get_mutable()->itemint64ids_ = const_cast< ::CoreML::Specification::Int64Vector*>(
      ::CoreML::Specification::Int64Vector::internal_default_instance());
}